

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OptimalControlProblem.cpp
# Opt level: O2

bool __thiscall
iDynTree::optimalcontrol::OptimalControlProblem::addLagrangeTerm
          (OptimalControlProblem *this,double weight,double startingTime,double finalTime,
          shared_ptr<iDynTree::optimalcontrol::QuadraticCost> *quadraticCost)

{
  OptimalControlProblemPimpl *this_00;
  bool bVar1;
  ostream *poVar2;
  string *psVar3;
  shared_ptr<iDynTree::optimalcontrol::Cost> local_1d8;
  char *local_1c8 [4];
  TimeRange timeRange;
  ostringstream errorMsg;
  
  TimeRange::TimeRange(&timeRange);
  bVar1 = TimeRange::setTimeInterval(&timeRange,startingTime,finalTime);
  if (bVar1) {
    this_00 = this->m_pimpl;
    std::__shared_ptr<iDynTree::optimalcontrol::Cost,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<iDynTree::optimalcontrol::QuadraticCost,void>
              ((__shared_ptr<iDynTree::optimalcontrol::Cost,(__gnu_cxx::_Lock_policy)2> *)&local_1d8
               ,&quadraticCost->
                 super___shared_ptr<iDynTree::optimalcontrol::QuadraticCost,_(__gnu_cxx::_Lock_policy)2>
              );
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&errorMsg,"addLagrangeTerm",(allocator<char> *)local_1c8);
    bVar1 = OptimalControlProblemPimpl::addCost
                      (this_00,weight,&timeRange,&local_1d8,false,true,(string *)&errorMsg);
    std::__cxx11::string::~string((string *)&errorMsg);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&local_1d8.
                super___shared_ptr<iDynTree::optimalcontrol::Cost,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
  }
  else {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&errorMsg);
    poVar2 = std::operator<<((ostream *)&errorMsg,"The cost named ");
    psVar3 = Cost::name_abi_cxx11_
                       ((Cost *)(quadraticCost->
                                super___shared_ptr<iDynTree::optimalcontrol::QuadraticCost,_(__gnu_cxx::_Lock_policy)2>
                                )._M_ptr);
    poVar2 = std::operator<<(poVar2,(string *)psVar3);
    std::operator<<(poVar2," has invalid time settings.");
    std::__cxx11::stringbuf::str();
    iDynTree::reportError("OptimalControlProblem","addLagrangeTerm",local_1c8[0]);
    std::__cxx11::string::~string((string *)local_1c8);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&errorMsg);
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool OptimalControlProblem::addLagrangeTerm(double weight, double startingTime, double finalTime, std::shared_ptr<QuadraticCost> quadraticCost)
        {
            TimeRange timeRange;

            if (!timeRange.setTimeInterval(startingTime, finalTime)){
                std::ostringstream errorMsg;
                errorMsg << "The cost named " << quadraticCost->name() <<" has invalid time settings.";
                reportError("OptimalControlProblem", "addLagrangeTerm", errorMsg.str().c_str());
                return false;
            }

            return (m_pimpl->addCost(weight, timeRange, quadraticCost, false, true, "addLagrangeTerm"));
        }